

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char8_t * fmt::v5::internal::format_uint<3u,fmt::v5::char8_t,unsigned_long>
                    (char8_t *buffer,unsigned_long value,int num_digits,bool upper)

{
  bool bVar1;
  char8_t *pcVar2;
  
  pcVar2 = buffer + num_digits;
  do {
    pcVar2 = pcVar2 + -1;
    *pcVar2 = (char8_t)value & 7 | 0x30;
    bVar1 = 7 < value;
    value = value >> 3;
  } while (bVar1);
  return buffer + num_digits;
}

Assistant:

inline Char *format_uint(Char *buffer, UInt value, int num_digits,
                         bool upper = false) {
  buffer += num_digits;
  Char *end = buffer;
  do {
    const char *digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}